

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::apply
          (QControlledGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  reference pvVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<double> *pcVar9;
  byte bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined8 uVar11;
  complex<double> local_348;
  complex<double> local_338;
  undefined8 local_328;
  undefined8 local_320;
  complex<double> local_318;
  complex<double> local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 auStack_2e8 [8];
  complex<double> x2_3;
  complex<double> x1_3;
  int64_t i2_1;
  int64_t i1_1;
  int64_t i_3;
  int64_t k_3;
  int64_t j_3;
  complex<double> local_288;
  undefined8 local_278;
  undefined8 local_270;
  complex<double> local_268;
  complex<double> local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 auStack_238 [8];
  complex<double> x2_2;
  complex<double> x1_2;
  int64_t j2_1;
  int64_t j1_1;
  int64_t j_2;
  int64_t k_2;
  int64_t i_2;
  int64_t nRight_1;
  int64_t nLeft_1;
  int64_t d_1;
  complex<double> local_1c8;
  undefined8 local_1b8;
  undefined8 local_1b0;
  complex<double> local_1a8;
  complex<double> local_198;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 auStack_178 [8];
  complex<double> x2_1;
  complex<double> x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  complex<double> local_118;
  undefined8 local_108;
  undefined8 local_100;
  complex<double> local_f8;
  complex<double> local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  complex<double> x2;
  complex<double> x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  int64_t d;
  undefined1 local_50 [8];
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<std::complex<double>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QControlledGate2<std::complex<double>_> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  iVar4 = dense::SquareMatrix<std::complex<double>_>::size(matrix);
  bVar10 = (byte)nbQubits;
  if (iVar4 != 1 << (bVar10 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(&mat1.data_);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (op,(SquareMatrix<std::complex<double>_> *)local_50);
  iVar2 = control(this);
  iVar3 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[0xf])();
  if (iVar2 < iVar3) {
    iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    iVar3 = control(this);
    lVar6 = (long)(1 << ((char)iVar2 - (char)iVar3 & 0x1fU));
    iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    lVar7 = (long)(1 << ((byte)iVar2 & 0x1f));
    iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    lVar8 = (long)(1 << ((bVar10 - (char)iVar2) - 1 & 0x1f));
    if (side == Left) {
      for (k = 0; iVar4 = dense::SquareMatrix<std::complex<double>_>::rows(matrix), k < iVar4;
          k = k + 1) {
        for (j = 0; j < lVar7; j = j + 1) {
          if (((this->controlState_ != 0) || (j % lVar6 < lVar6 / 2)) &&
             ((this->controlState_ != 1 || (lVar6 / 2 <= j % lVar6)))) {
            for (j1 = 0; j1 < lVar8; j1 = j1 + 1) {
              lVar1 = j1 + j * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar1);
              x2._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,k,lVar1 + lVar8);
              auStack_c8 = *(undefined1 (*) [8])pcVar9->_M_value;
              x2._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,0);
              std::operator*(pcVar9,(complex<double> *)(x2._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,0);
              std::operator*(pcVar9,(complex<double> *)auStack_c8);
              uVar11 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              std::operator+(&local_e8,&local_f8);
              local_d8 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
              uStack_d0 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar1);
              *(undefined8 *)pcVar9->_M_value = local_d8;
              *(undefined8 *)(pcVar9->_M_value + 8) = uStack_d0;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,1);
              std::operator*(pcVar9,(complex<double> *)(x2._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,1);
              std::operator*(pcVar9,(complex<double> *)auStack_c8);
              uVar11 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
              std::operator+(&local_118,(complex<double> *)&j_1);
              local_108 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
              local_100 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,k,lVar1 + lVar8);
              *(undefined8 *)pcVar9->_M_value = local_108;
              *(undefined8 *)(pcVar9->_M_value + 8) = local_100;
            }
          }
        }
      }
    }
    else {
      for (k_1 = 0; iVar4 = dense::SquareMatrix<std::complex<double>_>::cols(matrix), k_1 < iVar4;
          k_1 = k_1 + 1) {
        for (i_1 = 0; i_1 < lVar7; i_1 = i_1 + 1) {
          if (((this->controlState_ != 0) || (i_1 % lVar6 < lVar6 / 2)) &&
             ((this->controlState_ != 1 || (lVar6 / 2 <= i_1 % lVar6)))) {
            for (i1 = 0; i1 < lVar8; i1 = i1 + 1) {
              lVar1 = i1 + i_1 * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar1,k_1);
              x2_1._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,lVar1 + lVar8,k_1);
              auStack_178 = *(undefined1 (*) [8])pcVar9->_M_value;
              x2_1._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,0);
              std::operator*(pcVar9,(complex<double> *)(x2_1._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,1);
              std::operator*(pcVar9,(complex<double> *)auStack_178);
              uVar11 = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
              std::operator+(&local_198,&local_1a8);
              local_188 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
              uStack_180 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar1,k_1);
              *(undefined8 *)pcVar9->_M_value = local_188;
              *(undefined8 *)(pcVar9->_M_value + 8) = uStack_180;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,0);
              std::operator*(pcVar9,(complex<double> *)(x2_1._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,1);
              std::operator*(pcVar9,(complex<double> *)auStack_178);
              uVar11 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
              std::operator+(&local_1c8,(complex<double> *)&d_1);
              local_1b8 = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
              local_1b0 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,lVar1 + lVar8,k_1);
              *(undefined8 *)pcVar9->_M_value = local_1b8;
              *(undefined8 *)(pcVar9->_M_value + 8) = local_1b0;
            }
          }
        }
      }
    }
  }
  else {
    iVar2 = control(this);
    lVar6 = (long)(1 << (bVar10 - (char)iVar2 & 0x1f));
    iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    lVar7 = (long)(1 << ((byte)iVar2 & 0x1f));
    iVar2 = (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
              _vptr_QObject[0xf])();
    lVar8 = (long)(1 << ((bVar10 - (char)iVar2) - 1 & 0x1f));
    if (side == Left) {
      for (k_2 = 0; iVar4 = dense::SquareMatrix<std::complex<double>_>::cols(matrix), k_2 < iVar4;
          k_2 = k_2 + 1) {
        for (j_2 = 0; j_2 < lVar7; j_2 = j_2 + 1) {
          for (j1_1 = 0; j1_1 < lVar8; j1_1 = j1_1 + 1) {
            if (((this->controlState_ != 0) || (j1_1 % lVar6 < lVar6 / 2)) &&
               ((this->controlState_ != 1 || (lVar6 / 2 <= j1_1 % lVar6)))) {
              lVar1 = j1_1 + j_2 * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k_2,lVar1);
              x2_2._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,k_2,lVar1 + lVar8);
              auStack_238 = *(undefined1 (*) [8])pcVar9->_M_value;
              x2_2._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,0);
              std::operator*(pcVar9,(complex<double> *)(x2_2._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,0);
              std::operator*(pcVar9,(complex<double> *)auStack_238);
              uVar11 = CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
              std::operator+(&local_258,&local_268);
              local_248 = CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
              uStack_240 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k_2,lVar1);
              *(undefined8 *)pcVar9->_M_value = local_248;
              *(undefined8 *)(pcVar9->_M_value + 8) = uStack_240;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,1);
              std::operator*(pcVar9,(complex<double> *)(x2_2._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,1);
              std::operator*(pcVar9,(complex<double> *)auStack_238);
              uVar11 = CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
              std::operator+(&local_288,(complex<double> *)&j_3);
              local_278 = CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10);
              local_270 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,k_2,lVar1 + lVar8);
              *(undefined8 *)pcVar9->_M_value = local_278;
              *(undefined8 *)(pcVar9->_M_value + 8) = local_270;
            }
          }
        }
      }
    }
    else {
      for (k_3 = 0; iVar4 = dense::SquareMatrix<std::complex<double>_>::cols(matrix), k_3 < iVar4;
          k_3 = k_3 + 1) {
        for (i_3 = 0; i_3 < lVar7; i_3 = i_3 + 1) {
          for (i1_1 = 0; i1_1 < lVar8; i1_1 = i1_1 + 1) {
            if (((this->controlState_ != 0) || (i1_1 % lVar6 < lVar6 / 2)) &&
               ((this->controlState_ != 1 || (lVar6 / 2 <= i1_1 % lVar6)))) {
              lVar1 = i1_1 + i_3 * lVar8 * 2;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar1,k_3);
              x2_3._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,lVar1 + lVar8,k_3);
              auStack_2e8 = *(undefined1 (*) [8])pcVar9->_M_value;
              x2_3._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,0);
              std::operator*(pcVar9,(complex<double> *)(x2_3._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,0,1);
              std::operator*(pcVar9,(complex<double> *)auStack_2e8);
              uVar11 = CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
              std::operator+(&local_308,&local_318);
              local_2f8 = CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12);
              uStack_2f0 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar1,k_3);
              *(undefined8 *)pcVar9->_M_value = local_2f8;
              *(undefined8 *)(pcVar9->_M_value + 8) = uStack_2f0;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,0);
              std::operator*(pcVar9,(complex<double> *)(x2_3._M_value + 8));
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 ((SquareMatrix<std::complex<double>_> *)local_50,1,1);
              std::operator*(pcVar9,(complex<double> *)auStack_2e8);
              uVar11 = CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13);
              std::operator+(&local_338,&local_348);
              local_328 = CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14);
              local_320 = uVar11;
              pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                                 (matrix,lVar1 + lVar8,k_3);
              *(undefined8 *)pcVar9->_M_value = local_328;
              *(undefined8 *)(pcVar9->_M_value + 8) = local_320;
            }
          }
        }
      }
    }
  }
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat1.data_);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }